

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::FloorCase::compare(FloorCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  float fVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  ostream *poVar8;
  int iVar9;
  uint uVar10;
  deUint32 aBits;
  ostringstream *poVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  deUint32 u32;
  float fVar17;
  float fVar18;
  float fVar19;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar7 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar7 < 1) {
      return true;
    }
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    lVar15 = 0;
    do {
      local_34.value = floorf(*(float *)((long)pvVar4 + lVar15 * 4));
      fVar17 = *(float *)((long)pvVar5 + lVar15 * 4);
      uVar13 = (int)local_34.value - (int)fVar17;
      if ((uint)local_34.value < (uint)fVar17) {
        uVar13 = -((int)local_34.value - (int)fVar17);
      }
      if (uVar13 != 0) {
        poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar11->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
        poVar8 = Functional::operator<<(poVar8,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ULP diff ",0xf);
LAB_012981bb:
        local_40.value = (deUint64)uVar13;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar8);
        return false;
      }
      lVar15 = lVar15 + 1;
    } while (uVar7 != (uint)lVar15);
  }
  else {
    uVar10 = -1 << (0x17 - (&DAT_01c60718)[(ulong)PVar1 * 4] & 0x1f);
    if ((int)uVar7 < 1) {
      return true;
    }
    uVar13 = ~uVar10;
    fVar17 = (float)(uVar10 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar16 = 0;
    do {
      fVar19 = *(float *)((long)pvVar4 + uVar16 * 4);
      fVar2 = *(float *)((long)pvVar5 + uVar16 * 4);
      fVar18 = floorf(fVar19 - fVar17);
      iVar12 = (int)fVar18;
      fVar19 = floorf(fVar19 + fVar17);
      iVar14 = (int)fVar19;
      if (iVar14 < iVar12) {
LAB_012980bf:
        poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar11->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = [",5);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] with ULP threshold ",0x15);
        goto LAB_012981bb;
      }
      bVar6 = false;
      iVar9 = iVar12;
      do {
        fVar19 = (float)iVar9;
        uVar10 = (int)fVar19 - (int)fVar2;
        if ((uint)fVar19 < (uint)fVar2) {
          uVar10 = -((int)fVar19 - (int)fVar2);
        }
        if (uVar10 <= uVar13) {
          bVar6 = true;
          break;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 <= iVar14);
      if (!bVar6) goto LAB_012980bf;
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar7);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFloor(in0);

				const deUint32	ulpDiff		= getUlpDiff(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatFloor(in0-eps));
				const int		maxRes		= int(deFloatFloor(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiff(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}